

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkStopTests(ARKodeMem ark_mem,realtype tout,N_Vector yout,realtype *tret,int itask,int *ier)

{
  realtype rVar1;
  int iVar2;
  int in_ECX;
  realtype *in_RDX;
  N_Vector in_RSI;
  ARKodeMem in_RDI;
  int *in_R8;
  ARKodeMem in_XMM0_Qa;
  N_Vector x;
  realtype troundoff;
  int retval;
  int irfndp;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  x = (N_Vector)(in_RDI->uround * 100.0 * (ABS(in_RDI->tcur) + ABS(in_RDI->h)));
  if ((in_RDI->root_mem != (ARKodeRootMem)0x0) && (0 < in_RDI->root_mem->nrtfn)) {
    in_stack_ffffffffffffffc4 = in_RDI->root_mem->irfnd;
    if ((in_RDI->call_fullrhs == 0) &&
       ((in_stack_ffffffffffffffc4 != 0 &&
        (iVar2 = (*in_RDI->step_fullrhs)(in_RDI,in_RDI->tcur,in_RDI->yn,in_RDI->fn,1), iVar2 != 0)))
       ) {
      arkProcessError(in_RDI,-8,"ARKode","arkStopTests",
                      "At t = %lg, the right-hand side routine failed in an unrecoverable manner.");
      *in_R8 = -8;
      return 1;
    }
    in_stack_ffffffffffffffc0 = arkRootCheck2(in_XMM0_Qa);
    if (in_stack_ffffffffffffffc0 == 3) {
      arkProcessError((ARKodeMem)in_RDI->root_mem->tlo,(int)in_RDI,(char *)0xffffffea,"ARKode",
                      "arkStopTests","Root found at and very near t = %lg.");
      *in_R8 = -0x16;
      return 1;
    }
    if (in_stack_ffffffffffffffc0 == -0xc) {
      arkProcessError((ARKodeMem)in_RDI->root_mem->tlo,(int)in_RDI,(char *)0xfffffff4,"ARKode",
                      "arkStopTests",
                      "At t = %lg, the rootfinding routine failed in an unrecoverable manner.");
      *in_R8 = -0xc;
      return 1;
    }
    if (in_stack_ffffffffffffffc0 == 1) {
      rVar1 = in_RDI->root_mem->tlo;
      *in_RDX = rVar1;
      in_RDI->tretlast = rVar1;
      *in_R8 = 2;
      return 1;
    }
    if ((double)x < ABS(in_RDI->tcur - in_RDI->tretlast)) {
      in_stack_ffffffffffffffc0 = arkRootCheck3(in_RDX);
      if (in_stack_ffffffffffffffc0 == 0) {
        in_RDI->root_mem->irfnd = 0;
        if ((in_stack_ffffffffffffffc4 == 1) && (in_ECX == 2)) {
          rVar1 = in_RDI->tcur;
          *in_RDX = rVar1;
          in_RDI->tretlast = rVar1;
          N_VScale(2.12199579096527e-314,x,(N_Vector)0x116015d);
          *in_R8 = 0;
          return 1;
        }
      }
      else {
        if (in_stack_ffffffffffffffc0 == 1) {
          in_RDI->root_mem->irfnd = 1;
          rVar1 = in_RDI->root_mem->tlo;
          *in_RDX = rVar1;
          in_RDI->tretlast = rVar1;
          *in_R8 = 2;
          return 1;
        }
        if (in_stack_ffffffffffffffc0 == -0xc) {
          arkProcessError((ARKodeMem)in_RDI->root_mem->tlo,(int)in_RDI,(char *)0xfffffff4,"ARKode",
                          "arkStopTests",
                          "At t = %lg, the rootfinding routine failed in an unrecoverable manner.");
          *in_R8 = -0xc;
          return 1;
        }
      }
    }
  }
  iVar2 = (int)((ulong)in_XMM0_Qa >> 0x20);
  if ((in_ECX != 1) || ((in_RDI->tcur - (double)in_XMM0_Qa) * in_RDI->h < 0.0)) {
    if ((in_ECX != 2) || (ABS(in_RDI->tcur - in_RDI->tretlast) <= (double)x)) {
      if (in_RDI->tstopset != 0) {
        if (ABS(in_RDI->tcur - in_RDI->tstop) <= (double)x) {
          iVar2 = arkGetDky((ARKodeMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                            ,(realtype)in_RDI,iVar2,in_RSI);
          *in_R8 = iVar2;
          if (*in_R8 != 0) {
            arkProcessError((ARKodeMem)in_RDI->tstop,(int)in_RDI->tcur,(char *)in_RDI,
                            (char *)0xffffffea,"ARKode","arkStopTests",
                            "The value tstop = %lg is behind current t = %lg in the direction of integration."
                           );
            *in_R8 = -0x16;
            return 1;
          }
          rVar1 = in_RDI->tstop;
          *in_RDX = rVar1;
          in_RDI->tretlast = rVar1;
          in_RDI->tstopset = 0;
          *in_R8 = 1;
          return 1;
        }
        if (0.0 < ((in_RDI->tcur + in_RDI->hprime) - in_RDI->tstop) * in_RDI->h) {
          in_RDI->hprime = (in_RDI->tstop - in_RDI->tcur) * (in_RDI->uround * -4.0 + 1.0);
          in_RDI->eta = in_RDI->hprime / in_RDI->h;
        }
      }
      iVar2 = 0;
    }
    else {
      rVar1 = in_RDI->tcur;
      *in_RDX = rVar1;
      in_RDI->tretlast = rVar1;
      N_VScale((realtype)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),x,
               (N_Vector)0x1160385);
      *in_R8 = 0;
      iVar2 = 1;
    }
  }
  else {
    *in_RDX = (realtype)in_XMM0_Qa;
    in_RDI->tretlast = (realtype)in_XMM0_Qa;
    iVar2 = arkGetDky((ARKodeMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (realtype)in_RDI,iVar2,in_RSI);
    *in_R8 = iVar2;
    if (*in_R8 == 0) {
      *in_R8 = 0;
      iVar2 = 1;
    }
    else {
      arkProcessError(in_XMM0_Qa,(int)in_RDI,(char *)0xffffffea,"ARKode","arkStopTests",
                      "Trouble interpolating at tout = %lg. tout too far back in direction of integration"
                     );
      *in_R8 = -0x16;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int arkStopTests(ARKodeMem ark_mem, realtype tout, N_Vector yout,
                 realtype *tret, int itask, int *ier)
{
  int irfndp, retval;
  realtype troundoff;

  /* Estimate an infinitesimal time interval to be used as
     a roundoff for time quantities (based on current time
     and step size) */
  troundoff = FUZZ_FACTOR*ark_mem->uround *
    (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));

  /* First, check for a root in the last step taken, other than the
     last root found, if any.  If itask = ARK_ONE_STEP and y(tn) was not
     returned because of an intervening root, return y(tn) now.     */
  if (ark_mem->root_mem != NULL)
    if (ark_mem->root_mem->nrtfn > 0) {

      /* Shortcut to roots found in previous step */
      irfndp = ark_mem->root_mem->irfnd;

      /* If the full rhs was not computed in the last call to arkCompleteStep
         and roots were found in the previous step, then compute the full rhs
         for possible use in arkRootCheck2 (not always necessary) */
      if (!(ark_mem->call_fullrhs) && irfndp != 0) {
        retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tcur, ark_mem->yn,
                                       ark_mem->fn, ARK_FULLRHS_END);
        if (retval != 0) {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode", "arkStopTests",
                          MSG_ARK_RHSFUNC_FAILED);
          *ier = ARK_RHSFUNC_FAIL;
          return(1);
        }
      }

      retval = arkRootCheck2((void*) ark_mem);

      if (retval == CLOSERT) {
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkStopTests",
                        MSG_ARK_CLOSE_ROOTS, ark_mem->root_mem->tlo);
        *ier = ARK_ILL_INPUT;
        return(1);
      } else if (retval == ARK_RTFUNC_FAIL) {
        arkProcessError(ark_mem, ARK_RTFUNC_FAIL, "ARKode", "arkStopTests",
                        MSG_ARK_RTFUNC_FAILED, ark_mem->root_mem->tlo);
        *ier = ARK_RTFUNC_FAIL;
        return(1);
      } else if (retval == RTFOUND) {
        ark_mem->tretlast = *tret = ark_mem->root_mem->tlo;
        *ier = ARK_ROOT_RETURN;
        return(1);
      }

      /* If tn is distinct from tretlast (within roundoff),
         check remaining interval for roots */
      if ( SUNRabs(ark_mem->tcur - ark_mem->tretlast) > troundoff ) {

        retval = arkRootCheck3((void*) ark_mem);

        if (retval == ARK_SUCCESS) {     /* no root found */
          ark_mem->root_mem->irfnd = 0;
          if ((irfndp == 1) && (itask == ARK_ONE_STEP)) {
            ark_mem->tretlast = *tret = ark_mem->tcur;
            N_VScale(ONE, ark_mem->yn, yout);
            *ier = ARK_SUCCESS;
            return(1);
          }
        } else if (retval == RTFOUND) {  /* a new root was found */
          ark_mem->root_mem->irfnd = 1;
          ark_mem->tretlast = *tret = ark_mem->root_mem->tlo;
          *ier = ARK_ROOT_RETURN;
          return(1);
        } else if (retval == ARK_RTFUNC_FAIL) {  /* g failed */
          arkProcessError(ark_mem, ARK_RTFUNC_FAIL, "ARKode", "arkStopTests",
                          MSG_ARK_RTFUNC_FAILED, ark_mem->root_mem->tlo);
          *ier = ARK_RTFUNC_FAIL;
          return(1);
        }
      }

    } /* end of root stop check */

  /* In ARK_NORMAL mode, test if tout was reached */
  if ( (itask == ARK_NORMAL) &&
       ((ark_mem->tcur-tout)*ark_mem->h >= ZERO) ) {
    ark_mem->tretlast = *tret = tout;
    *ier = arkGetDky(ark_mem, tout, 0, yout);
    if (*ier != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                      "arkStopTests", MSG_ARK_BAD_TOUT, tout);
      *ier = ARK_ILL_INPUT;
      return(1);
    }
    *ier = ARK_SUCCESS;
    return(1);
  }

  /* In ARK_ONE_STEP mode, test if tn was returned */
  if ( itask == ARK_ONE_STEP &&
       SUNRabs(ark_mem->tcur - ark_mem->tretlast) > troundoff ) {
    ark_mem->tretlast = *tret = ark_mem->tcur;
    N_VScale(ONE, ark_mem->yn, yout);
    *ier = ARK_SUCCESS;
    return(1);
  }

  /* Test for tn at tstop or near tstop */
  if ( ark_mem->tstopset ) {

    if ( SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff) {
      *ier = arkGetDky(ark_mem, ark_mem->tstop, 0, yout);
      if (*ier != ARK_SUCCESS) {
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkStopTests",
                        MSG_ARK_BAD_TSTOP, ark_mem->tstop, ark_mem->tcur);
        *ier = ARK_ILL_INPUT;
        return(1);
      }
      ark_mem->tretlast = *tret = ark_mem->tstop;
      ark_mem->tstopset = SUNFALSE;
      *ier = ARK_TSTOP_RETURN;
      return(1);
    }

    /* If next step would overtake tstop, adjust stepsize */
    if ( (ark_mem->tcur + ark_mem->hprime - ark_mem->tstop)*ark_mem->h > ZERO ) {
      ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur)*(ONE-FOUR*ark_mem->uround);
      ark_mem->eta = ark_mem->hprime/ark_mem->h;
    }
  }

  return(0);
}